

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::rotation(Matrix4f *__return_storage_ptr__,Quat4f *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float xw;
  float yz;
  float yw;
  float xz;
  float zw;
  float xy;
  float zz;
  float yy;
  float xx;
  Quat4f qq;
  Quat4f *q_local;
  
  qq.m_elements._8_8_ = q;
  Quat4f::normalized((Quat4f *)&yy);
  fVar1 = Quat4f::x((Quat4f *)&yy);
  fVar2 = Quat4f::x((Quat4f *)&yy);
  fVar3 = Quat4f::y((Quat4f *)&yy);
  fVar4 = Quat4f::y((Quat4f *)&yy);
  fVar5 = Quat4f::z((Quat4f *)&yy);
  fVar6 = Quat4f::z((Quat4f *)&yy);
  fVar7 = Quat4f::x((Quat4f *)&yy);
  fVar8 = Quat4f::y((Quat4f *)&yy);
  fVar9 = Quat4f::z((Quat4f *)&yy);
  fVar10 = Quat4f::w((Quat4f *)&yy);
  fVar11 = Quat4f::x((Quat4f *)&yy);
  fVar12 = Quat4f::z((Quat4f *)&yy);
  fVar13 = Quat4f::y((Quat4f *)&yy);
  fVar14 = Quat4f::w((Quat4f *)&yy);
  fVar15 = Quat4f::y((Quat4f *)&yy);
  fVar16 = Quat4f::z((Quat4f *)&yy);
  fVar17 = Quat4f::x((Quat4f *)&yy);
  fVar18 = Quat4f::w((Quat4f *)&yy);
  fVar19 = fVar3 * fVar4 + fVar5 * fVar6;
  fVar5 = fVar1 * fVar2 + fVar5 * fVar6;
  fVar1 = fVar1 * fVar2 + fVar3 * fVar4;
  Matrix4f(__return_storage_ptr__,1.0 - (fVar19 + fVar19),(fVar7 * fVar8 - fVar9 * fVar10) * 2.0,
           (fVar11 * fVar12 + fVar13 * fVar14) * 2.0,0.0,(fVar7 * fVar8 + fVar9 * fVar10) * 2.0,
           1.0 - (fVar5 + fVar5),(fVar15 * fVar16 - fVar17 * fVar18) * 2.0,0.0,
           (fVar11 * fVar12 - fVar13 * fVar14) * 2.0,(fVar15 * fVar16 + fVar17 * fVar18) * 2.0,
           1.0 - (fVar1 + fVar1),0.0,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::rotation( const Quat4f& q )
{
	Quat4f qq = q.normalized();

	float xx = qq.x() * qq.x();
	float yy = qq.y() * qq.y();
	float zz = qq.z() * qq.z();

	float xy = qq.x() * qq.y();
	float zw = qq.z() * qq.w();

	float xz = qq.x() * qq.z();
	float yw = qq.y() * qq.w();

	float yz = qq.y() * qq.z();
	float xw = qq.x() * qq.w();

	return Matrix4f
	(
		1.0f - 2.0f * ( yy + zz ),		2.0f * ( xy - zw ),				2.0f * ( xz + yw ),				0.0f,
		2.0f * ( xy + zw ),				1.0f - 2.0f * ( xx + zz ),		2.0f * ( yz - xw ),				0.0f,
		2.0f * ( xz - yw ),				2.0f * ( yz + xw ),				1.0f - 2.0f * ( xx + yy ),		0.0f,
		0.0f,							0.0f,							0.0f,							1.0f
	);
}